

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

bool __thiscall c4::yml::Parser::_handle_key_anchors_and_refs(Parser *this)

{
  pfn_error p_Var1;
  code *pcVar2;
  char *pcVar3;
  Location LVar4;
  Location LVar5;
  undefined8 uVar6;
  bool bVar7;
  undefined1 uVar8;
  State *pSVar9;
  size_t sVar10;
  csubstr cVar11;
  csubstr fmt;
  csubstr rem;
  char msg [31];
  char *pcStack_60;
  size_t local_58;
  char *pcStack_38;
  size_t local_30;
  
  pSVar9 = this->m_state;
  if ((pSVar9->flags & 0x80) != 0) {
    builtin_strncpy(msg,"check failed: (!has_any(RVAL))",0x1f);
    if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar2 = (code *)swi(3);
      uVar8 = (*pcVar2)();
      return (bool)uVar8;
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar11 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_30 = cVar11.len;
    pcStack_38 = cVar11.str;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x7185) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x7185) << 0x40,8);
    LVar4.name.str = pcStack_38;
    LVar4.name.len = local_30;
    (*p_Var1)(msg,0x1f,LVar4,(this->m_stack).m_callbacks.m_user_data);
    pSVar9 = this->m_state;
  }
  pcVar3 = (pSVar9->line_contents).rem.str;
  rem.len = (pSVar9->line_contents).rem.len;
  if (rem.len != 0) {
    rem.str = pcVar3;
    if (*pcVar3 == '&') {
      if ((~pSVar9->flags & 0x220U) == 0) {
        if ((pSVar9->flags & 0x40U) == 0) {
          builtin_strncpy(msg,"check failed: (has_any(RKEY))",0x1e);
          if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar2 = (code *)swi(3);
            uVar8 = (*pcVar2)();
            return (bool)uVar8;
          }
          p_Var1 = (this->m_stack).m_callbacks.m_error;
          cVar11 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          local_58 = cVar11.len;
          pcStack_60 = cVar11.str;
          LVar5.super_LineCol.col = 0;
          LVar5.super_LineCol.offset = SUB168(ZEXT816(0x718c) << 0x40,0);
          LVar5.super_LineCol.line = SUB168(ZEXT816(0x718c) << 0x40,8);
          LVar5.name.str = pcStack_60;
          LVar5.name.len = local_58;
          (*p_Var1)(msg,0x1e,LVar5,(this->m_stack).m_callbacks.m_user_data);
        }
        _append_key_val_null(this,pcVar3 + -1);
        this->m_state->flags = this->m_state->flags & 0xffffffdf;
      }
      else {
        sVar10 = basic_substring<const_char>::first_of(&rem,' ',0);
        if ((sVar10 != 0xffffffffffffffff) && (rem.len < sVar10)) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar2 = (code *)swi(3);
            uVar8 = (*pcVar2)();
            return (bool)uVar8;
          }
          handle_error(0x1ea013,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1569,"pos <= len || pos == npos");
        }
        if (sVar10 == 0xffffffffffffffff) {
          msg._0_8_ = rem.str;
          msg._8_6_ = (undefined6)rem.len;
          msg[0xe] = (char)(rem.len >> 0x30);
          msg[0xf] = (char)(rem.len >> 0x38);
        }
        else {
          basic_substring<const_char>::basic_substring
                    ((basic_substring<const_char> *)msg,rem.str,sVar10);
        }
        uVar6 = msg._0_8_;
        sVar10 = CONCAT17(msg[0xf],CONCAT16(msg[0xe],msg._8_6_));
        _line_progressed(this,sVar10);
        if (sVar10 == 0) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar2 = (code *)swi(3);
            uVar8 = (*pcVar2)();
            return (bool)uVar8;
          }
          handle_error(0x1ea013,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1533,"first >= 0 && first <= len");
        }
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)msg,(char *)(uVar6 + 1),sVar10 - 1);
        uVar6 = msg._0_8_;
        sVar10 = CONCAT17(msg[0xf],CONCAT16(msg[0xe],msg._8_6_));
        _move_key_anchor_to_val_anchor(this);
        (this->m_key_anchor).str = (char *)uVar6;
        (this->m_key_anchor).len = sVar10;
        cVar11.len = rem.len;
        cVar11.str = rem.str;
        sVar10 = LineContents::current_col(&this->m_state->line_contents,cVar11);
        this->m_key_anchor_indentation = sVar10;
      }
      return true;
    }
    if (*pcVar3 == '*') {
      bVar7 = is_debugger_attached();
      if ((bVar7) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar2 = (code *)swi(3);
        uVar8 = (*pcVar2)();
        return (bool)uVar8;
      }
      fmt.len = 0x40;
      fmt.str = "ERROR: not implemented - this should have been catched elsewhere";
      _err<>(this,fmt);
      if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar2 = (code *)swi(3);
        uVar8 = (*pcVar2)();
        return (bool)uVar8;
      }
      handle_error(0x1fd9a3,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x719e);
    }
  }
  return false;
}

Assistant:

bool Parser::_handle_key_anchors_and_refs()
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, !has_any(RVAL));
    const csubstr rem = m_state->line_contents.rem;
    if(rem.begins_with('&'))
    {
        _c4dbgp("found a key anchor!!!");
        if(has_all(QMRK|SSCL))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, has_any(RKEY));
            _c4dbgp("there is a stored key, so this anchor is for the next element");
            _append_key_val_null(rem.str - 1);
            rem_flags(QMRK);
            return true;
        }
        csubstr anchor = rem.left_of(rem.first_of(' '));
        _line_progressed(anchor.len);
        anchor = anchor.sub(1); // skip the first character
        _move_key_anchor_to_val_anchor();
        _c4dbgpf("key anchor value: '{}'", anchor);
        m_key_anchor = anchor;
        m_key_anchor_indentation = m_state->line_contents.current_col(rem);
        return true;
    }
    else if(C4_UNLIKELY(rem.begins_with('*')))
    {
        _c4err("not implemented - this should have been catched elsewhere");
        C4_NEVER_REACH();
        return false;
    }
    return false;
}